

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bstrcmp(const_bstring b0,const_bstring b1)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *puVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  
  iVar6 = -0x8000;
  if ((((b1 != (const_bstring)0x0 && b0 != (const_bstring)0x0) &&
       (puVar3 = b0->data, puVar3 != (uchar *)0x0)) && (puVar4 = b1->data, puVar4 != (uchar *)0x0))
     && ((uVar1 = b0->slen, -1 < (int)uVar1 && (uVar2 = b1->slen, -1 < (int)uVar2)))) {
    uVar5 = uVar2;
    if ((int)uVar1 < (int)uVar2) {
      uVar5 = uVar1;
    }
    if ((uVar1 == uVar2) && (uVar1 == 0 || puVar3 == puVar4)) {
      return 0;
    }
    if (0 < (int)uVar5) {
      uVar7 = 0;
      do {
        iVar6 = (int)(char)puVar3[uVar7] - (int)(char)puVar4[uVar7];
        if (iVar6 != 0) {
          return iVar6;
        }
        if (puVar3[uVar7] == '\0') {
          return 0;
        }
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
    }
    iVar6 = 1;
    if ((int)uVar1 <= (int)uVar2) {
      return -(uint)((int)uVar1 < (int)uVar2);
    }
  }
  return iVar6;
}

Assistant:

int bstrcmp (const_bstring b0, const_bstring b1) {
int i, v, n;

	if (b0 == NULL || b1 == NULL || b0->data == NULL || b1->data == NULL ||
		b0->slen < 0 || b1->slen < 0) return SHRT_MIN;
	n = b0->slen; if (n > b1->slen) n = b1->slen;
	if (b0->slen == b1->slen && (b0->data == b1->data || b0->slen == 0))
		return BSTR_OK;

	for (i = 0; i < n; i ++) {
		v = ((char) b0->data[i]) - ((char) b1->data[i]);
		if (v != 0) return v;
		if (b0->data[i] == (unsigned char) '\0') return BSTR_OK;
	}

	if (b0->slen > n) return 1;
	if (b1->slen > n) return -1;
	return BSTR_OK;
}